

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_functions.cc
# Opt level: O0

uint32_t hash_djb2_last8(uint8_t *value,int len)

{
  int local_1c;
  uint hash;
  int c;
  int min;
  int len_local;
  uint8_t *value_local;
  
  local_1c = len;
  if (7 < len) {
    local_1c = 8;
  }
  hash = 0x1505;
  c = local_1c;
  while (c != 0) {
    hash = hash * 0x21 + (uint)value[(long)(c + -1) + (long)(len - local_1c)];
    c = c + -1;
  }
  return hash;
}

Assistant:

uint32_t hash_djb2_last8(uint8_t *value, int len)
{
    int min = MIN(len, 8), c;
    unsigned hash = 5381;
    c = min;
    while(c--){
        hash = ((hash << 5) + hash) + *((uint8_t*)value + (len - min) + c);
    }
    return hash;
}